

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O3

Cnf_Dat_t * Bmcg_ManAddNewCnf(Bmcg_Man_t *p,int f,int nFramesAdd)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  Gia_Man_t *pGia;
  Cnf_Dat_t *pCVar5;
  undefined4 *__s;
  uint *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pGia = Bmcg_ManUnfold(p,f,nFramesAdd);
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeUnf = p->timeUnf + lVar8 + lVar7;
  if (pGia == (Gia_Man_t *)0x0) {
    pCVar5 = (Cnf_Dat_t *)0x0;
  }
  else {
    iVar4 = clock_gettime(3,&local_48);
    if (iVar4 < 0) {
      local_38 = 1;
    }
    else {
      lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
      local_38 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
    }
    pCVar5 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,1,0,0,0);
    uVar9 = (ulong)pGia->nObjs;
    __s = (undefined4 *)malloc(uVar9 * 4);
    memset(__s,0xff,uVar9 * 4);
    *__s = 0;
    if (1 < (long)uVar9) {
      piVar2 = pCVar5->pObj2Count;
      puVar6 = &pGia->pObjs[1].Value;
      lVar7 = 1;
      do {
        if ((0 < piVar2[lVar7]) || ((~*(uint *)(puVar6 + -2) & 0x9fffffff) == 0)) {
          lVar8 = (long)(int)*puVar6;
          if ((lVar8 < 0) || ((p->vFr2Sat).nSize <= (int)*puVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar3 = (p->vFr2Sat).pArray;
          iVar4 = piVar3[lVar8];
          if (iVar4 == -1) {
            iVar4 = p->nSatVars;
            p->nSatVars = iVar4 + 1;
            piVar3[lVar8] = iVar4;
            uVar9 = (ulong)(uint)pGia->nObjs;
          }
          __s[lVar7] = iVar4;
        }
        lVar7 = lVar7 + 1;
        puVar6 = puVar6 + 3;
      } while (lVar7 < (int)uVar9);
    }
    Gia_ManStop(pGia);
    if (0 < pCVar5->nLiterals) {
      piVar2 = *pCVar5->pClauses;
      lVar7 = 0;
      do {
        uVar1 = piVar2[lVar7];
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x134,"int Abc_Lit2LitV(int *, int)");
        }
        if ((int)__s[uVar1 >> 1] < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        piVar2[lVar7] = (uVar1 & 1) + __s[uVar1 >> 1] * 2;
        lVar7 = lVar7 + 1;
      } while (lVar7 < pCVar5->nLiterals);
    }
    free(__s);
    iVar4 = clock_gettime(3,&local_48);
    if (iVar4 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    p->timeCnf = p->timeCnf + lVar7 + local_38;
  }
  return pCVar5;
}

Assistant:

Cnf_Dat_t * Bmcg_ManAddNewCnf( Bmcg_Man_t * p, int f, int nFramesAdd )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew = Bmcg_ManUnfold( p, f, nFramesAdd );
    Cnf_Dat_t * pCnf;
    Gia_Obj_t * pObj; 
    int i, iVar, * pMap;
    p->timeUnf += Abc_Clock() - clk;
    if ( pNew == NULL )
        return NULL;
    clk = Abc_Clock();
    pCnf = (Cnf_Dat_t *) Mf_ManGenerateCnf( pNew, 8, 1, 0, 0, 0 );
    pMap = ABC_FALLOC( int, Gia_ManObjNum(pNew) );
    pMap[0] = 0;
    Gia_ManForEachObj1( pNew, pObj, i )
    {
        if ( pCnf->pObj2Count[i] <= 0 && !Gia_ObjIsCi(pObj) )
            continue;
        iVar = Vec_IntEntry( &p->vFr2Sat, pObj->Value );
        if ( iVar == -1 )
            Vec_IntWriteEntry( &p->vFr2Sat, pObj->Value, (iVar = p->nSatVars++) );
        pMap[i] = iVar;
    }
    Gia_ManStop( pNew );
    for ( i = 0; i < pCnf->nLiterals; i++ )
        pCnf->pClauses[0][i] = Abc_Lit2LitV( pMap, pCnf->pClauses[0][i] );
    ABC_FREE( pMap );
    p->timeCnf += Abc_Clock() - clk;
    return pCnf;
}